

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

SUNErrCode SUNLinSol_PCGSetPrecType(SUNLinearSolver S,int pretype)

{
  *(int *)((long)S->content + 4) = pretype;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_PCGSetPrecType(SUNLinearSolver S, int pretype)
{
  SUNFunctionBegin(S->sunctx);
  /* Check for legal pretype */
  SUNAssert((pretype == SUN_PREC_NONE) || (pretype == SUN_PREC_LEFT) ||
              (pretype == SUN_PREC_RIGHT) || (pretype == SUN_PREC_BOTH),
            SUN_ERR_ARG_OUTOFRANGE);

  /* Set pretype */
  PRETYPE(S) = pretype;
  return SUN_SUCCESS;
}